

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_vertex_input_divisor_state
          (Impl *this,Value *state,VkPipelineVertexInputDivisorStateCreateInfoKHR **out_info)

{
  bool bVar1;
  uint uVar2;
  VkPipelineVertexInputDivisorStateCreateInfo *pVVar3;
  Type pGVar4;
  ConstValueIterator pGVar5;
  Type pGVar6;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *divisor;
  ConstValueIterator divisor_itr;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *divisors;
  VkVertexInputBindingDivisorDescription *new_divisors;
  VkPipelineVertexInputDivisorStateCreateInfo *info;
  VkPipelineVertexInputDivisorStateCreateInfoKHR **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkPipelineVertexInputDivisorStateCreateInfo>
                     (&this->allocator);
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"vertexBindingDivisorCount");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->vertexBindingDivisorCount = uVar2;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"vertexBindingDivisors");
  if (bVar1) {
    divisors = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)ScratchAllocator::allocate_n_cleared<VkVertexInputBindingDivisorDescription>
                            (&this->allocator,(ulong)pVVar3->vertexBindingDivisorCount);
    pVVar3->pVertexBindingDivisors = (VkVertexInputBindingDivisorDescription *)divisors;
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"vertexBindingDivisors");
    for (divisor = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::Begin(pGVar4);
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::End(pGVar4), divisor != pGVar5; divisor = divisor + 1) {
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)divisor,"binding");
      uVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetUint(pGVar6);
      (divisors->data_).s.length = uVar2;
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)divisor,"divisor");
      uVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetUint(pGVar6);
      (divisors->data_).s.hashcode = uVar2;
      divisors = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)((long)&divisors->data_ + 8);
    }
  }
  *out_info = pVVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_vertex_input_divisor_state(const Value &state, VkPipelineVertexInputDivisorStateCreateInfoKHR **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineVertexInputDivisorStateCreateInfoKHR>();
	info->vertexBindingDivisorCount = state["vertexBindingDivisorCount"].GetUint();
	if (state.HasMember("vertexBindingDivisors"))
	{
		auto *new_divisors =
				allocator.allocate_n_cleared<VkVertexInputBindingDivisorDescriptionEXT>(info->vertexBindingDivisorCount);
		info->pVertexBindingDivisors = new_divisors;

		auto &divisors = state["vertexBindingDivisors"];
		for (auto divisor_itr = divisors.Begin(); divisor_itr != divisors.End(); ++divisor_itr, new_divisors++)
		{
			auto &divisor = *divisor_itr;
			new_divisors->binding = divisor["binding"].GetUint();
			new_divisors->divisor = divisor["divisor"].GetUint();
		}
	}

	*out_info = info;
	return true;
}